

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ConstraintPrototypeSyntax::ConstraintPrototypeSyntax
          (ConstraintPrototypeSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,TokenList *qualifiers,
          Token keyword,NameSyntax *name,Token semi)

{
  Token TVar1;
  NameSyntax *pNVar2;
  NameSyntax *local_40;
  NameSyntax *local_38;
  NameSyntax *name_local;
  TokenList *qualifiers_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  ConstraintPrototypeSyntax *this_local;
  Token keyword_local;
  
  TVar1 = semi;
  keyword_local._0_8_ = keyword.info;
  this_local = keyword._0_8_;
  local_38 = name;
  name_local = (NameSyntax *)qualifiers;
  qualifiers_local = (TokenList *)attributes;
  attributes_local = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,ConstraintPrototype,attributes);
  TokenList::TokenList(&this->qualifiers,(TokenList *)name_local);
  *(ConstraintPrototypeSyntax **)&this->keyword = this_local;
  (this->keyword).info = (Info *)keyword_local._0_8_;
  local_40 = local_38;
  not_null<slang::syntax::NameSyntax*>::not_null<slang::syntax::NameSyntax*,void>
            ((not_null<slang::syntax::NameSyntax*> *)&this->name,&local_40);
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  semi.info = TVar1.info;
  (this->semi).info = semi.info;
  (this->qualifiers).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  pNVar2 = not_null<slang::syntax::NameSyntax_*>::operator->(&this->name);
  (pNVar2->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  return;
}

Assistant:

ConstraintPrototypeSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, const TokenList& qualifiers, Token keyword, NameSyntax& name, Token semi) :
        MemberSyntax(SyntaxKind::ConstraintPrototype, attributes), qualifiers(qualifiers), keyword(keyword), name(&name), semi(semi) {
        this->qualifiers.parent = this;
        this->name->parent = this;
    }